

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O2

HandlePtr __thiscall
dg::vr::ValueRelations::getCorresponding
          (ValueRelations *this,ValueRelations *other,Handle otherH,
          VectorSet<const_llvm::Value_*> *otherEqual)

{
  pointer ppVVar1;
  V pVVar2;
  pointer prVar3;
  bool bVar4;
  HandlePtr lt;
  HandlePtr pBVar5;
  Bucket *h;
  reference_wrapper<const_dg::vr::Bucket> rt;
  size_t sVar6;
  Handle pBVar7;
  const_iterator __begin2;
  pointer ppVVar8;
  pair<std::reference_wrapper<const_dg::vr::Bucket>,_bool> pVar9;
  
  ppVVar8 = (otherEqual->vec).
            super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppVVar1 = (otherEqual->vec).
            super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppVVar8 == ppVVar1) {
    prVar3 = (otherH->relatedBuckets)._M_elems[0xb].vec.
             super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (prVar3 == (otherH->relatedBuckets)._M_elems[0xb].vec.
                  super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      sVar6 = RelationsGraph<dg::vr::ValueRelations>::getBorderId(&other->graph,otherH);
      rt._M_data = RelationsGraph<dg::vr::ValueRelations>::getBorderB(&this->graph,sVar6);
      if (rt._M_data == (Bucket *)0x0) {
        sVar6 = RelationsGraph<dg::vr::ValueRelations>::getBorderId(&other->graph,otherH);
        pBVar7 = newBorderBucket(this,sVar6);
        return pBVar7;
      }
    }
    else {
      pBVar5 = getCorresponding(this,other,prVar3->_M_data);
      if (pBVar5 == (HandlePtr)0x0) {
LAB_001413d9:
        rt._M_data = (Handle)0x0;
      }
      else {
        rt._M_data = newPlaceholderBucket<dg::vr::Bucket>(this,pBVar5);
        bVar4 = RelationsGraph<dg::vr::ValueRelations>::addRelation
                          (&this->graph,pBVar5,PT,rt._M_data,(Relations *)0x0);
        this->changed = (bool)(this->changed | bVar4);
      }
    }
  }
  else {
    rt._M_data = (Bucket *)0x0;
    for (; ppVVar8 != ppVVar1; ppVVar8 = ppVVar8 + 1) {
      pVVar2 = *ppVVar8;
      lt = maybeGet(this,pVVar2);
      pBVar5 = lt;
      if ((rt._M_data != (Bucket *)0x0) &&
         (pBVar5 = rt._M_data, lt != rt._M_data && lt != (HandlePtr)0x0)) {
        bVar4 = haveConflictingRelations<dg::vr::Bucket,dg::vr::Bucket>(this,lt,EQ,rt._M_data);
        if (bVar4) goto LAB_001413d9;
        set<dg::vr::Bucket,dg::vr::Bucket>(this,lt,EQ,rt._M_data);
        pBVar5 = maybeGet(this,pVVar2);
      }
      rt._M_data = pBVar5;
    }
    if (rt._M_data == (Bucket *)0x0) {
      pVVar2 = *(otherEqual->vec).
                super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      h = RelationsGraph<dg::vr::ValueRelations>::getNewBucket(&this->graph);
      pVar9 = add(this,pVVar2,h);
      rt = pVar9.first._M_data;
    }
  }
  return rt._M_data;
}

Assistant:

ValueRelations::HandlePtr
ValueRelations::getCorresponding(const ValueRelations &other, Handle otherH,
                                 const VectorSet<V> &otherEqual) {
    if (otherEqual.empty()) { // other is a placeholder bucket, therefore it is
                              // pointed to from other bucket
        if (!otherH.hasRelation(Relations::PF)) {
            HandlePtr thisH = getBorderH(other.getBorderId(otherH));
            return thisH ? thisH : &newBorderBucket(other.getBorderId(otherH));
        }
        assert(otherH.hasRelation(Relations::PF));
        Handle otherFromH = otherH.getRelated(Relations::PF);
        HandlePtr thisFromH = getCorresponding(other, otherFromH);
        if (!thisFromH)
            return nullptr;

        Handle h = newPlaceholderBucket(*thisFromH);
        bool ch = graph.addRelation(*thisFromH, Relations::PT, h);
        updateChanged(ch);
        return &h;
    }

    // otherwise find unique handle for all equal elements from other
    HandlePtr mH = nullptr;
    for (V val : otherEqual) {
        HandlePtr oH = maybeGet(val);
        if (!mH) // first handle found
            mH = oH;
        else if (oH && oH != mH) { // found non-equal handle in this
            if (hasConflictingRelation(*oH, *mH, Relations::EQ))
                return nullptr;
            set(*oH, Relations::EQ, *mH);
            mH = maybeGet(val); // update possibly invalidated handle
            assert(mH);
        }
    }
    return mH ? mH : &add(otherEqual.any(), graph.getNewBucket()).first.get();
}